

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

bool str_cmp(char *astr,char *bstr)

{
  long lVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  
  if (bstr == (char *)0x0 || astr == (char *)0x0) {
    return true;
  }
  lVar1 = 0;
  while( true ) {
    cVar3 = astr[lVar1];
    if (cVar3 == '\0') {
      cVar3 = bstr[lVar1];
      iVar2 = 0;
      if (cVar3 == '\0') {
        return false;
      }
    }
    else {
      iVar2 = cVar3 + 0x20;
      if (0x19 < (byte)(cVar3 + 0xbfU)) {
        iVar2 = (int)cVar3;
      }
      cVar3 = bstr[lVar1];
    }
    iVar4 = cVar3 + 0x20;
    if (0x19 < (byte)(cVar3 + 0xbfU)) {
      iVar4 = (int)cVar3;
    }
    if (iVar2 != iVar4) break;
    lVar1 = lVar1 + 1;
  }
  return true;
}

Assistant:

bool str_cmp(const char *astr, const char *bstr)
{
	if (astr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null astr, bstr: {} ({}:{} dev=pimp)",gLastFile, gLastLine, bstr);
		return true;
	}

	if (bstr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null bstr, astr: {}", astr);
		return true;
	}

	for (; *astr || *bstr; astr++, bstr++)
	{
		if (LOWER(*astr) != LOWER(*bstr))
			return true;
	}

	return false;
}